

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilSort.c
# Opt level: O2

void Abc_SelectSortDec(word *pData,int nSize)

{
  word wVar1;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  
  iVar3 = 1;
  if (1 < nSize) {
    iVar3 = nSize;
  }
  uVar4 = 1;
  for (uVar5 = 0; uVar5 != iVar3 - 1; uVar5 = uVar5 + 1) {
    uVar7 = uVar5 & 0xffffffff;
    uVar6 = uVar4;
    while( true ) {
      if ((uint)nSize == uVar6) break;
      uVar2 = uVar6 & 0xffffffff;
      if ((uint)pData[uVar6] <= (uint)pData[(int)uVar7]) {
        uVar2 = uVar7;
      }
      uVar7 = uVar2;
      uVar6 = uVar6 + 1;
    }
    wVar1 = pData[uVar5];
    pData[uVar5] = pData[(int)uVar7];
    pData[(int)uVar7] = wVar1;
    uVar4 = uVar4 + 1;
  }
  return;
}

Assistant:

static inline void Abc_SelectSortDec( word * pData, int nSize )
{
    int i, j, best_i;
    for ( i = 0; i < nSize-1; i++ )
    {
        best_i = i;
        for ( j = i+1; j < nSize; j++ )
            if ( (unsigned)pData[j] > (unsigned)pData[best_i] )
                best_i = j;
        ABC_SWAP( word, pData[i], pData[best_i] );
    }
}